

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void random_fe_non_zero(secp256k1_fe *nz)

{
  uint64_t *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint64_t uVar92;
  uint64_t uVar93;
  uint64_t uVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  int iVar99;
  uint32_t uVar100;
  uint uVar101;
  ulong uVar102;
  long lVar103;
  ulong extraout_RAX;
  ulong uVar104;
  long lVar105;
  int extraout_EDX;
  secp256k1_ge *extraout_RDX;
  uint64_t *t;
  ulong uVar106;
  secp256k1_gej *psVar107;
  secp256k1_fe *psVar108;
  ulong uVar109;
  int iVar110;
  secp256k1_ge *psVar111;
  secp256k1_fe *b;
  secp256k1_gej *psVar112;
  secp256k1_fe *psVar113;
  secp256k1_fe *psVar114;
  secp256k1_fe *psVar115;
  secp256k1_fe *psVar116;
  secp256k1_ge *psVar117;
  secp256k1_ge *r;
  secp256k1_gej *b_00;
  secp256k1_gej *__src;
  secp256k1_gej *psVar118;
  ulong uVar119;
  ulong uVar120;
  ulong unaff_R12;
  secp256k1_ge *a;
  ulong unaff_R13;
  secp256k1_fe *a_00;
  secp256k1_fe *psVar121;
  bool bVar122;
  undefined1 auVar123 [16];
  secp256k1_fe sStack_660;
  secp256k1_fe *psStack_630;
  secp256k1_fe sStack_620;
  secp256k1_fe sStack_5f0;
  secp256k1_fe sStack_5c0;
  secp256k1_fe sStack_588;
  secp256k1_fe sStack_558;
  secp256k1_fe sStack_528;
  secp256k1_gej *psStack_4f0;
  secp256k1_gej *psStack_4e8;
  secp256k1_fe *psStack_4e0;
  undefined1 *puStack_4d8;
  secp256k1_fe *psStack_4d0;
  secp256k1_fe *psStack_4c8;
  secp256k1_gej sStack_4c0;
  secp256k1_ge *psStack_420;
  secp256k1_ge *psStack_418;
  secp256k1_gej *psStack_410;
  secp256k1_ge *psStack_408;
  secp256k1_ge *psStack_400;
  secp256k1_ge *psStack_3f8;
  undefined1 auStack_3f0 [88];
  undefined8 uStack_398;
  secp256k1_fe *psStack_390;
  secp256k1_fe *psStack_380;
  secp256k1_gej *psStack_378;
  ulong uStack_370;
  ulong uStack_368;
  secp256k1_fe sStack_360;
  secp256k1_fe sStack_330;
  secp256k1_fe *psStack_300;
  ulong uStack_2f8;
  ulong uStack_2f0;
  secp256k1_fe *psStack_2e8;
  secp256k1_fe *psStack_2e0;
  secp256k1_fe *psStack_2d8;
  secp256k1_fe sStack_2d0;
  secp256k1_fe sStack_2a0;
  uint64_t uStack_270;
  uint64_t uStack_268;
  uint64_t uStack_260;
  uint64_t uStack_258;
  secp256k1_gej *psStack_250;
  secp256k1_fe *psStack_248;
  secp256k1_fe *psStack_240;
  secp256k1_fe *psStack_230;
  undefined1 auStack_228 [24];
  ulong uStack_210;
  ulong uStack_208;
  undefined8 uStack_200;
  ushort auStack_1f8 [16];
  uint16_t auStack_1d8 [16];
  uint16_t auStack_1b8 [16];
  ushort auStack_198 [16];
  ushort auStack_178 [16];
  ushort auStack_158 [16];
  ulong auStack_138 [8];
  undefined1 auStack_f8 [32];
  uint64_t uStack_d8;
  undefined8 uStack_d0;
  ulong uStack_c8;
  uint64_t uStack_c0;
  uint64_t uStack_b8;
  uint64_t uStack_b0;
  uint64_t uStack_a8;
  undefined8 uStack_a0;
  secp256k1_fe *psStack_90;
  secp256k1_fe sStack_60;
  secp256k1_fe *psStack_30;
  
  iVar110 = -0xb;
  psVar108 = nz;
  while (iVar110 = iVar110 + 1, iVar110 != 0) {
    random_fe(nz);
    secp256k1_fe_normalize(nz);
    psVar108 = nz;
    secp256k1_fe_verify(nz);
    if (nz->normalized == 0) {
      random_fe_non_zero_cold_1();
      break;
    }
    if (((nz->n[3] != 0 || nz->n[1] != 0) || (nz->n[2] != 0 || nz->n[0] != 0)) || nz->n[4] != 0) {
      return;
    }
  }
  random_fe_non_zero_cold_2();
  psVar113 = &sStack_60;
  psVar121 = &sStack_60;
  psStack_30 = nz;
  uVar100 = secp256k1_testrand_int(9);
  secp256k1_fe_normalize(psVar108);
  if (uVar100 == 0) {
    return;
  }
  sStack_60.magnitude = 0;
  sStack_60.normalized = 1;
  sStack_60.n[0] = 0;
  sStack_60.n[1] = 0;
  sStack_60.n[2] = 0;
  sStack_60.n[3] = 0;
  sStack_60.n[4] = 0;
  secp256k1_fe_verify(&sStack_60);
  secp256k1_fe_verify(&sStack_60);
  sStack_60.n[0] = 0x1ffffdfffff85e;
  sStack_60.n[1] = 0x1ffffffffffffe - sStack_60.n[1];
  sStack_60.n[2] = 0x1ffffffffffffe - sStack_60.n[2];
  sStack_60.n[3] = 0x1ffffffffffffe - sStack_60.n[3];
  sStack_60.n[4] = 0x1fffffffffffe - sStack_60.n[4];
  sStack_60.magnitude = 1;
  sStack_60.normalized = 0;
  secp256k1_fe_verify(&sStack_60);
  b = (secp256k1_fe *)(ulong)(uVar100 - 1);
  secp256k1_fe_mul_int_unchecked(&sStack_60,uVar100 - 1);
  secp256k1_fe_verify(psVar108);
  secp256k1_fe_verify(&sStack_60);
  iVar110 = sStack_60.magnitude + psVar108->magnitude;
  if (iVar110 < 0x21) {
    uVar92 = psVar108->n[1];
    uVar93 = psVar108->n[2];
    uVar94 = psVar108->n[3];
    psVar108->n[0] = psVar108->n[0] + sStack_60.n[0];
    psVar108->n[1] = uVar92 + sStack_60.n[1];
    psVar108->n[2] = uVar93 + sStack_60.n[2];
    psVar108->n[3] = uVar94 + sStack_60.n[3];
    psVar108->n[4] = psVar108->n[4] + sStack_60.n[4];
    psVar108->magnitude = iVar110;
    psVar108->normalized = 0;
    psVar113 = psVar108;
    secp256k1_fe_verify(psVar108);
    if (psVar108->magnitude == uVar100) {
      return;
    }
  }
  else {
    random_field_element_magnitude_cold_2();
  }
  random_field_element_magnitude_cold_1();
  psStack_90 = psVar108;
  auStack_228._0_8_ = psVar113->n[0];
  auStack_228._8_8_ = psVar113->n[1];
  unique0x00006c80 = *(undefined1 (*) [16])(psVar113->n + 2);
  uStack_208 = psVar113->n[4];
  uStack_200._0_4_ = psVar113->magnitude;
  uStack_200._4_4_ = psVar113->normalized;
  if (extraout_EDX == 0) {
    psStack_240 = (secp256k1_fe *)0x1584d0;
    secp256k1_fe_mul((secp256k1_fe *)auStack_228,(secp256k1_fe *)auStack_228,b);
LAB_001584d0:
    uStack_c8 = psVar113->n[0];
    uStack_c0 = psVar113->n[1];
    uStack_b8 = psVar113->n[2];
    uStack_b0 = psVar113->n[3];
    uStack_a8 = psVar113->n[4];
    uStack_a0._0_4_ = psVar113->magnitude;
    uStack_a0._4_4_ = psVar113->normalized;
    psVar107 = (secp256k1_gej *)&uStack_c8;
    auStack_f8._0_8_ = b->n[0];
    auStack_f8._8_8_ = b->n[1];
    auStack_f8._16_16_ = *(undefined1 (*) [16])(b->n + 2);
    uStack_d8 = b->n[4];
    uStack_d0._0_4_ = b->magnitude;
    uStack_d0._4_4_ = b->normalized;
    b = (secp256k1_fe *)auStack_f8;
    psVar121 = (secp256k1_fe *)auStack_228;
    psStack_240 = (secp256k1_fe *)0x158520;
    secp256k1_fe_normalize_var(psVar121);
    psStack_240 = (secp256k1_fe *)0x158528;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar107);
    psStack_240 = (secp256k1_fe *)0x158530;
    secp256k1_fe_normalize_var(b);
    psStack_240 = (secp256k1_fe *)0x158540;
    secp256k1_fe_get_b32((uchar *)auStack_158,(secp256k1_fe *)psVar107);
    psStack_240 = (secp256k1_fe *)0x158550;
    secp256k1_fe_get_b32((uchar *)auStack_178,b);
    psStack_240 = (secp256k1_fe *)0x158560;
    secp256k1_fe_get_b32((uchar *)auStack_198,psVar121);
    lVar103 = 0x10;
    lVar105 = 0;
    do {
      uVar4 = auStack_178[lVar103 + -1];
      *(ushort *)((long)auStack_1b8 + lVar105) =
           auStack_158[lVar103 + -1] << 8 | auStack_158[lVar103 + -1] >> 8;
      uVar5 = auStack_198[lVar103 + -1];
      *(ushort *)((long)auStack_1d8 + lVar105) = uVar4 << 8 | uVar4 >> 8;
      *(ushort *)((long)auStack_1f8 + lVar105) = uVar5 << 8 | uVar5 >> 8;
      lVar105 = lVar105 + 2;
      lVar103 = lVar103 + -1;
    } while (lVar103 != 0);
    psStack_240 = (secp256k1_fe *)0x1585c7;
    mulmod256((uint16_t *)auStack_138,auStack_1b8,auStack_1d8,test_fe_mul::m16);
    lVar103 = 0;
    uVar106 = extraout_RAX;
    do {
      uVar102 = uVar106 & 0xffffffff;
      bVar2 = *(byte *)((long)auStack_138 + lVar103);
      psVar108 = (secp256k1_fe *)(ulong)bVar2;
      bVar3 = *(byte *)((long)auStack_1f8 + lVar103);
      psVar112 = (secp256k1_gej *)(ulong)bVar3;
      uVar106 = (ulong)((uint)bVar2 - (uint)bVar3);
      if (bVar2 == bVar3) {
        uVar106 = uVar102;
      }
      iVar110 = (int)uVar106;
      if (bVar2 != bVar3) goto LAB_001585ef;
      lVar103 = lVar103 + 1;
    } while (lVar103 != 0x20);
    iVar110 = 0;
LAB_001585ef:
    if (iVar110 == 0) {
      return;
    }
    psStack_240 = (secp256k1_fe *)0x15860a;
    test_fe_mul_cold_2();
  }
  else {
    psVar107 = (secp256k1_gej *)auStack_228;
    psStack_240 = (secp256k1_fe *)0x15825a;
    psVar108 = b;
    psVar112 = psVar107;
    secp256k1_fe_verify((secp256k1_fe *)psVar107);
    if ((int)uStack_200 < 9) {
      unaff_R12 = auStack_228._16_8_;
      unaff_R13 = uStack_210;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = auStack_228._0_8_ * 2;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uStack_210;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auStack_228._8_8_ * 2;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = auStack_228._16_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uStack_208;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uStack_208;
      uVar102 = SUB168(auVar8 * auVar48,0);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar102 & 0xfffffffffffff;
      auVar123 = auVar7 * auVar47 + auVar123 * auVar46 + auVar9 * ZEXT816(0x1000003d10);
      uVar106 = auVar123._0_8_;
      auStack_138[0] = uVar106 & 0xfffffffffffff;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar106 >> 0x34 | auVar123._8_8_ << 0xc;
      uVar106 = uStack_208 * 2;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = auStack_228._0_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar106;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = auStack_228._8_8_ * 2;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uStack_210;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = auStack_228._16_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = auStack_228._16_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar102 >> 0x34 | SUB168(auVar8 * auVar48,8) << 0xc;
      auVar123 = auVar10 * auVar49 + auVar78 + auVar11 * auVar50 + auVar12 * auVar51 +
                 auVar13 * ZEXT816(0x1000003d10);
      uVar102 = auVar123._0_8_;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar102 >> 0x34 | auVar123._8_8_ << 0xc;
      auStack_f8._0_8_ = (uVar102 & 0xfffffffffffff) >> 0x30;
      uStack_c8 = uVar102 & 0xffffffffffff;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = auStack_228._0_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = auStack_228._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = auStack_228._8_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar106;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = auStack_228._16_8_ * 2;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uStack_210;
      auVar123 = auVar15 * auVar53 + auVar79 + auVar16 * auVar54;
      uVar102 = auVar123._0_8_;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar102 >> 0x34 | auVar123._8_8_ << 0xc;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = (uVar102 & 0xfffffffffffff) << 4 | auStack_f8._0_8_;
      auVar123 = auVar14 * auVar52 + ZEXT816(0x1000003d1) * auVar55;
      uVar119 = auVar123._0_8_;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar119 >> 0x34 | auVar123._8_8_ << 0xc;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auStack_228._0_8_ * 2;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = auStack_228._8_8_;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = auStack_228._16_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar106;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uStack_210;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uStack_210;
      auVar7 = auVar18 * auVar57 + auVar81 + auVar19 * auVar58;
      uVar102 = auVar7._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar102 & 0xfffffffffffff;
      auVar123 = auVar17 * auVar56 + auVar80 + auVar20 * ZEXT816(0x1000003d10);
      uVar120 = auVar123._0_8_;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar102 >> 0x34 | auVar7._8_8_ << 0xc;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar120 >> 0x34 | auVar123._8_8_ << 0xc;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = auStack_228._0_8_ * 2;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = auStack_228._16_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = auStack_228._8_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = auStack_228._8_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uStack_210;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar106;
      auVar83 = auVar23 * auVar61 + auVar83;
      uVar106 = auVar83._0_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar106 & 0xfffffffffffff;
      auVar123 = auVar21 * auVar59 + auVar82 + auVar22 * auVar60 + auVar24 * ZEXT816(0x1000003d10);
      uVar102 = auVar123._0_8_;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = (uVar102 >> 0x34 | auVar123._8_8_ << 0xc) + auStack_138[0];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar106 >> 0x34 | auVar83._8_8_ << 0xc;
      auVar84 = auVar25 * ZEXT816(0x1000003d10) + auVar84;
      uVar106 = auVar84._0_8_;
      uStack_210 = uVar106 & 0xfffffffffffff;
      auStack_228._16_8_ = uVar102 & 0xfffffffffffff;
      uStack_208 = (uVar106 >> 0x34 | auVar84._8_8_ << 0xc) + uStack_c8;
      uStack_200._0_4_ = 1;
      uStack_200._4_4_ = 0;
      psStack_240 = (secp256k1_fe *)0x1584be;
      psStack_230 = b;
      auStack_228._0_8_ = uVar119 & 0xfffffffffffff;
      auStack_228._8_8_ = uVar120 & 0xfffffffffffff;
      secp256k1_fe_verify((secp256k1_fe *)auStack_228);
      goto LAB_001584d0;
    }
  }
  psStack_240 = (secp256k1_fe *)test_sqrt;
  test_fe_mul_cold_1();
  psVar114 = &sStack_2d0;
  psVar115 = &sStack_2d0;
  psVar116 = &sStack_2d0;
  a_00 = &sStack_2d0;
  psStack_2d8 = (secp256k1_fe *)0x158629;
  psStack_250 = psVar107;
  psStack_248 = b;
  psStack_240 = psVar121;
  uVar101 = secp256k1_fe_sqrt(&sStack_2d0,&psVar112->x);
  if (uVar101 == (psVar108 == (secp256k1_fe *)0x0)) {
    psStack_2d8 = (secp256k1_fe *)0x1587ed;
    test_sqrt_cold_7();
LAB_001587ed:
    a_00 = b;
    psStack_2d8 = (secp256k1_fe *)0x1587f2;
    test_sqrt_cold_6();
LAB_001587f2:
    psStack_2d8 = (secp256k1_fe *)0x1587f7;
    test_sqrt_cold_5();
LAB_001587f7:
    psVar116 = psVar114;
    psStack_2d8 = (secp256k1_fe *)0x1587fc;
    test_sqrt_cold_4();
LAB_001587fc:
    psStack_2d8 = (secp256k1_fe *)0x158801;
    test_sqrt_cold_3();
LAB_00158801:
    psStack_2d8 = (secp256k1_fe *)0x158806;
    test_sqrt_cold_2();
  }
  else {
    if (psVar108 == (secp256k1_fe *)0x0) {
      return;
    }
    psStack_2d8 = (secp256k1_fe *)0x15864d;
    secp256k1_fe_verify(&sStack_2d0);
    psVar114 = psVar115;
    b = &sStack_2d0;
    if (1 < sStack_2d0.magnitude) goto LAB_001587ed;
    sStack_2a0.n[0] = 0x3ffffbfffff0bc - sStack_2d0.n[0];
    sStack_2a0.n[1] = 0x3ffffffffffffc - sStack_2d0.n[1];
    sStack_2a0.n[2] = 0x3ffffffffffffc - sStack_2d0.n[2];
    sStack_2a0.n[3] = 0x3ffffffffffffc - sStack_2d0.n[3];
    psVar121 = (secp256k1_fe *)(0x3fffffffffffc - sStack_2d0.n[4]);
    sStack_2a0.magnitude = 2;
    sStack_2a0.normalized = 0;
    psStack_2d8 = (secp256k1_fe *)0x1586af;
    sStack_2a0.n[4] = (uint64_t)psVar121;
    uStack_270 = sStack_2a0.n[2];
    uStack_268 = sStack_2a0.n[3];
    uStack_260 = sStack_2a0.n[0];
    uStack_258 = sStack_2a0.n[1];
    secp256k1_fe_verify(&sStack_2a0);
    psStack_2d8 = (secp256k1_fe *)0x1586b7;
    secp256k1_fe_verify(&sStack_2d0);
    psStack_2d8 = (secp256k1_fe *)0x1586bf;
    psVar114 = psVar108;
    secp256k1_fe_verify(psVar108);
    iVar110 = psVar108->magnitude + sStack_2d0.magnitude;
    if (0x20 < iVar110) goto LAB_001587f2;
    sStack_2d0.n[0] = psVar108->n[0] + sStack_2d0.n[0];
    sStack_2d0.n[1] = psVar108->n[1] + sStack_2d0.n[1];
    sStack_2d0.n[2] = psVar108->n[2] + sStack_2d0.n[2];
    sStack_2d0.n[3] = psVar108->n[3] + sStack_2d0.n[3];
    sStack_2d0.n[4] = sStack_2d0.n[4] + psVar108->n[4];
    sStack_2d0.normalized = 0;
    psStack_2d8 = (secp256k1_fe *)0x158704;
    sStack_2d0.magnitude = iVar110;
    secp256k1_fe_verify(&sStack_2d0);
    psStack_2d8 = (secp256k1_fe *)0x15870e;
    secp256k1_fe_verify(&sStack_2a0);
    psStack_2d8 = (secp256k1_fe *)0x158716;
    psVar114 = psVar108;
    secp256k1_fe_verify(psVar108);
    a_00 = &sStack_2d0;
    if (0x1e < psVar108->magnitude) goto LAB_001587f7;
    sStack_2a0.n[0] = psVar108->n[0] + uStack_260;
    sStack_2a0.n[1] = psVar108->n[1] + uStack_258;
    a_00 = &sStack_2a0;
    sStack_2a0.n[2] = psVar108->n[2] + uStack_270;
    sStack_2a0.n[3] = psVar108->n[3] + uStack_268;
    psVar121 = (secp256k1_fe *)((long)psVar121->n + psVar108->n[4]);
    sStack_2a0.normalized = 0;
    sStack_2a0.magnitude = psVar108->magnitude + 2;
    psStack_2d8 = (secp256k1_fe *)0x158766;
    sStack_2a0.n[4] = (uint64_t)psVar121;
    secp256k1_fe_verify(a_00);
    psStack_2d8 = (secp256k1_fe *)0x158771;
    secp256k1_fe_normalize(&sStack_2d0);
    psStack_2d8 = (secp256k1_fe *)0x158779;
    secp256k1_fe_normalize(a_00);
    psStack_2d8 = (secp256k1_fe *)0x158781;
    secp256k1_fe_verify(&sStack_2d0);
    psVar108 = &sStack_2d0;
    if (sStack_2d0.normalized == 0) goto LAB_001587fc;
    auVar95._8_8_ = sStack_2d0.n[1];
    auVar95._0_8_ = sStack_2d0.n[0];
    auVar96._8_8_ = sStack_2d0.n[3];
    auVar96._0_8_ = sStack_2d0.n[2];
    if ((SUB168(auVar95 | auVar96,8) == 0 && SUB168(auVar95 | auVar96,0) == 0) &&
        sStack_2d0.n[4] == 0) {
      return;
    }
    psVar108 = &sStack_2a0;
    psStack_2d8 = (secp256k1_fe *)0x1587b4;
    psVar116 = psVar108;
    secp256k1_fe_verify(psVar108);
    if (sStack_2a0.normalized == 0) goto LAB_00158801;
    auVar97._8_8_ = sStack_2a0.n[1];
    auVar97._0_8_ = sStack_2a0.n[0];
    auVar98._8_8_ = sStack_2a0.n[3];
    auVar98._0_8_ = sStack_2a0.n[2];
    if ((SUB168(auVar97 | auVar98,8) == 0 && SUB168(auVar97 | auVar98,0) == 0) &&
        (secp256k1_fe *)sStack_2a0.n[4] == (secp256k1_fe *)0x0) {
      return;
    }
  }
  psStack_2d8 = (secp256k1_fe *)random_group_element_jacobian_test;
  test_sqrt_cold_1();
  psVar111 = (secp256k1_ge *)(psVar116 + 2);
  psStack_390 = (secp256k1_fe *)0x15882e;
  psVar107 = psVar112;
  psStack_300 = psVar108;
  uStack_2f8 = unaff_R12;
  uStack_2f0 = unaff_R13;
  psStack_2e8 = a_00;
  psStack_2e0 = psVar121;
  psStack_2d8 = psVar113;
  random_fe_non_zero_test((secp256k1_fe *)psVar111);
  psStack_390 = (secp256k1_fe *)0x158836;
  psVar117 = psVar111;
  secp256k1_fe_verify((secp256k1_fe *)psVar111);
  if (psVar116[2].magnitude < 9) {
    psStack_380 = psVar116;
    psStack_378 = psVar112;
    uVar106 = (psVar111->x).n[0];
    uVar102 = psVar116[2].n[1];
    uVar119 = psVar116[2].n[2];
    uVar120 = psVar116[2].n[3];
    uVar6 = psVar116[2].n[4];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar106 * 2;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar120;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar102 * 2;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar119;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar6;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar6;
    uVar104 = SUB168(auVar28 * auVar64,0);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar104 & 0xfffffffffffff;
    auVar123 = auVar27 * auVar63 + auVar26 * auVar62 + auVar29 * ZEXT816(0x1000003d10);
    uVar109 = auVar123._0_8_;
    sStack_360.n[0] = uVar109 & 0xfffffffffffff;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar109 >> 0x34 | auVar123._8_8_ << 0xc;
    uVar6 = uVar6 * 2;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar106;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar6;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar102 * 2;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar120;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar119;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar119;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar104 >> 0x34 | SUB168(auVar28 * auVar64,8) << 0xc;
    auVar123 = auVar30 * auVar65 + auVar85 + auVar31 * auVar66 + auVar32 * auVar67 +
               auVar33 * ZEXT816(0x1000003d10);
    uStack_368 = auVar123._0_8_;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uStack_368 >> 0x34 | auVar123._8_8_ << 0xc;
    uStack_370 = (uStack_368 & 0xfffffffffffff) >> 0x30;
    uStack_368 = uStack_368 & 0xffffffffffff;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar106;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar106;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar102;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar6;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar119 * 2;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar120;
    auVar123 = auVar35 * auVar69 + auVar86 + auVar36 * auVar70;
    uVar104 = auVar123._0_8_;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar104 >> 0x34 | auVar123._8_8_ << 0xc;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = (uVar104 & 0xfffffffffffff) << 4 | uStack_370;
    auVar123 = auVar34 * auVar68 + ZEXT816(0x1000003d1) * auVar71;
    uVar104 = auVar123._0_8_;
    sStack_330.n[0] = uVar104 & 0xfffffffffffff;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar104 >> 0x34 | auVar123._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar106 * 2;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar102;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar119;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar6;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar120;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar120;
    auVar7 = auVar38 * auVar73 + auVar88 + auVar39 * auVar74;
    uVar104 = auVar7._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar104 & 0xfffffffffffff;
    auVar123 = auVar37 * auVar72 + auVar87 + auVar40 * ZEXT816(0x1000003d10);
    uVar109 = auVar123._0_8_;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar104 >> 0x34 | auVar7._8_8_ << 0xc;
    sStack_330.n[1] = uVar109 & 0xfffffffffffff;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar109 >> 0x34 | auVar123._8_8_ << 0xc;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar106 * 2;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar119;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar102;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar102;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar120;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar6;
    auVar90 = auVar43 * auVar77 + auVar90;
    uVar106 = auVar90._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar106 & 0xfffffffffffff;
    auVar123 = auVar41 * auVar75 + auVar89 + auVar42 * auVar76 + auVar44 * ZEXT816(0x1000003d10);
    uVar102 = auVar123._0_8_;
    sStack_330.n[2] = uVar102 & 0xfffffffffffff;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (uVar102 >> 0x34 | auVar123._8_8_ << 0xc) + sStack_360.n[0];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar106 >> 0x34 | auVar90._8_8_ << 0xc;
    auVar91 = auVar45 * ZEXT816(0x1000003d10) + auVar91;
    uVar106 = auVar91._0_8_;
    sStack_330.n[3] = uVar106 & 0xfffffffffffff;
    sStack_330.n[4] = (uVar106 >> 0x34 | auVar91._8_8_ << 0xc) + uStack_368;
    sStack_330.magnitude = 1;
    sStack_330.normalized = 0;
    psStack_390 = (secp256k1_fe *)0x158a8a;
    secp256k1_fe_verify(&sStack_330);
    psStack_390 = (secp256k1_fe *)0x158a9d;
    secp256k1_fe_mul(&sStack_360,&sStack_330,(secp256k1_fe *)psVar111);
    psVar107 = psStack_378;
    psVar108 = psStack_380;
    psStack_390 = (secp256k1_fe *)0x158ab5;
    secp256k1_fe_mul(psStack_380,&psStack_378->x,&sStack_330);
    psStack_390 = (secp256k1_fe *)0x158ac5;
    secp256k1_fe_mul(psVar108 + 1,&psVar107->y,&sStack_360);
    *(int *)psVar108[3].n = (int)(psVar107->z).n[0];
    return;
  }
  psStack_390 = (secp256k1_fe *)random_fe_non_zero_test;
  random_group_element_jacobian_test_cold_1();
  psStack_390 = psVar116;
  while( true ) {
    uStack_398._0_4_ = 0x158af3;
    uStack_398._4_4_ = 0;
    random_fe_test(&psVar117->x);
    uStack_398._0_4_ = 0x158afb;
    uStack_398._4_4_ = 0;
    r = psVar117;
    secp256k1_fe_verify(&psVar117->x);
    if ((psVar117->x).normalized == 0) break;
    auVar123 = *(undefined1 (*) [16])((psVar117->x).n + 2) | *(undefined1 (*) [16])(psVar117->x).n;
    if ((auVar123._8_8_ != 0 || auVar123._0_8_ != 0) || (psVar117->x).n[4] != 0) {
      return;
    }
  }
  uStack_398 = secp256k1_ge_set_all_gej_var;
  random_fe_non_zero_test_cold_1();
  auStack_3f0._48_8_ = psVar117;
  auStack_3f0._56_8_ = unaff_R12;
  auStack_3f0._64_8_ = unaff_R13;
  auStack_3f0._72_8_ = psVar112;
  auStack_3f0._80_8_ = psVar121;
  uStack_398 = (code *)psVar111;
  if (extraout_RDX == (secp256k1_ge *)0x0) {
    psStack_3f8 = (secp256k1_ge *)0xffffffffffffffff;
  }
  else {
    psVar108 = &psVar107->z;
    psStack_3f8 = (secp256k1_ge *)0xffffffffffffffff;
    psVar111 = (secp256k1_ge *)0x0;
    psVar117 = r;
    do {
      psStack_400 = (secp256k1_ge *)0x158b64;
      secp256k1_gej_verify((secp256k1_gej *)(psVar108 + -2));
      if ((int)psVar108[1].n[0] == 0) {
        if (psStack_3f8 == (secp256k1_ge *)0xffffffffffffffff) {
          uVar92 = psVar108->n[0];
          uVar93 = psVar108->n[1];
          auVar123 = *(undefined1 (*) [16])(psVar108->n + 2);
          iVar110 = psVar108->magnitude;
          iVar99 = psVar108->normalized;
          (psVar117->x).n[4] = psVar108->n[4];
          (psVar117->x).magnitude = iVar110;
          (psVar117->x).normalized = iVar99;
          *(undefined1 (*) [16])((psVar117->x).n + 2) = auVar123;
          (psVar117->x).n[0] = uVar92;
          (psVar117->x).n[1] = uVar93;
          psStack_3f8 = psVar111;
        }
        else {
          psStack_400 = (secp256k1_ge *)0x158b92;
          secp256k1_fe_mul(&psVar117->x,&r[(long)psStack_3f8].x,psVar108);
          psStack_3f8 = psVar111;
        }
      }
      else {
        psStack_400 = (secp256k1_ge *)0x158b74;
        secp256k1_ge_set_infinity(psVar117);
      }
      psVar111 = (secp256k1_ge *)((long)(psVar111->x).n + 1);
      psVar117 = psVar117 + 1;
      psVar108 = (secp256k1_fe *)(psVar108[3].n + 1);
    } while (extraout_RDX != psVar111);
  }
  psVar117 = psStack_3f8;
  if (psStack_3f8 == (secp256k1_ge *)0xffffffffffffffff) {
    return;
  }
  a = (secp256k1_ge *)((long)psStack_3f8 * 0x68);
  psVar112 = (secp256k1_gej *)(r + (long)psStack_3f8);
  b_00 = (secp256k1_gej *)auStack_3f0;
  psStack_400 = (secp256k1_ge *)0x158bf5;
  secp256k1_fe_inv_var((secp256k1_fe *)b_00,(secp256k1_fe *)psVar112);
  if (psVar117 != (secp256k1_ge *)0x0) {
    psVar111 = (secp256k1_ge *)&psVar117[-1].field_0x67;
    a = r + -1 + (long)psVar117;
    psVar117 = (secp256k1_ge *)&psVar107[(long)&psVar117[-1].field_0x67].infinity;
    do {
      if ((int)(psVar117->x).n[0] == 0) {
        psStack_400 = (secp256k1_ge *)0x158c30;
        secp256k1_fe_mul(&r[(long)psStack_3f8].x,&a->x,(secp256k1_fe *)auStack_3f0);
        psVar112 = (secp256k1_gej *)auStack_3f0;
        psStack_400 = (secp256k1_ge *)0x158c4d;
        b_00 = psVar112;
        secp256k1_fe_mul((secp256k1_fe *)psVar112,(secp256k1_fe *)psVar112,
                         &psVar107[(long)psStack_3f8].z);
        psStack_3f8 = psVar111;
      }
      psVar117 = (secp256k1_ge *)(psVar117[-2].y.n + 1);
      a = a + -1;
      bVar122 = psVar111 != (secp256k1_ge *)0x0;
      psVar111 = (secp256k1_ge *)&psVar111[-1].field_0x67;
    } while (bVar122);
  }
  if (psVar107[(long)psStack_3f8].infinity == 0) {
    puVar1 = r[(long)psStack_3f8].x.n + 4;
    *puVar1 = auStack_3f0._32_8_;
    puVar1[1] = auStack_3f0._40_8_;
    puVar1 = r[(long)psStack_3f8].x.n + 2;
    *puVar1 = auStack_3f0._16_8_;
    puVar1[1] = auStack_3f0._24_8_;
    r[(long)psStack_3f8].x.n[0] = auStack_3f0._0_8_;
    r[(long)psStack_3f8].x.n[1] = auStack_3f0._8_8_;
    for (psVar111 = extraout_RDX; psVar111 != (secp256k1_ge *)0x0;
        psVar111 = (secp256k1_ge *)&psVar111[-1].field_0x67) {
      if (psVar107->infinity == 0) {
        psStack_400 = (secp256k1_ge *)0x158cb9;
        secp256k1_ge_set_gej_zinv(r,psVar107,&r->x);
      }
      psStack_400 = (secp256k1_ge *)0x158cc1;
      secp256k1_ge_verify(r);
      r = r + 1;
      psVar107 = psVar107 + 1;
    }
    return;
  }
  psStack_400 = (secp256k1_ge *)test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  __src = &sStack_4c0;
  psVar118 = &sStack_4c0;
  psStack_4c8 = (secp256k1_fe *)0x158d0f;
  psStack_420 = a;
  psStack_418 = psVar117;
  psStack_410 = psVar107;
  psStack_408 = r;
  psStack_400 = psVar111;
  memcpy(&sStack_4c0,b_00,0x98);
  psStack_4c8 = (secp256k1_fe *)0x158d17;
  secp256k1_gej_verify(&sStack_4c0);
  psStack_4c8 = (secp256k1_fe *)0x158d1f;
  secp256k1_gej_verify(psVar112);
  psStack_4c8 = (secp256k1_fe *)0x158d2c;
  secp256k1_fe_cmov(&sStack_4c0.x,&psVar112->x,0);
  psVar108 = &psVar112->y;
  psStack_4c8 = (secp256k1_fe *)0x158d3f;
  secp256k1_fe_cmov(&sStack_4c0.y,psVar108,0);
  psVar113 = &sStack_4c0.z;
  psVar121 = &psVar112->z;
  psStack_4c8 = (secp256k1_fe *)0x158d55;
  secp256k1_fe_cmov(psVar113,psVar121,0);
  psStack_4c8 = (secp256k1_fe *)0x158d5d;
  secp256k1_gej_verify(&sStack_4c0);
  psStack_4c8 = (secp256k1_fe *)0x158d68;
  psVar107 = b_00;
  iVar110 = gej_xyz_equals_gej(&sStack_4c0,b_00);
  if (iVar110 == 0) {
    psStack_4c8 = (secp256k1_fe *)0x158dff;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_4c8 = (secp256k1_fe *)0x158d7b;
    secp256k1_gej_verify(&sStack_4c0);
    psStack_4c8 = (secp256k1_fe *)0x158d83;
    secp256k1_gej_verify(psVar112);
    psStack_4c8 = (secp256k1_fe *)0x158d93;
    secp256k1_fe_cmov(&sStack_4c0.x,&psVar112->x,1);
    psStack_4c8 = (secp256k1_fe *)0x158da5;
    secp256k1_fe_cmov(&sStack_4c0.y,psVar108,1);
    psStack_4c8 = (secp256k1_fe *)0x158db5;
    secp256k1_fe_cmov(psVar113,psVar121,1);
    sStack_4c0.infinity = sStack_4c0.infinity & 0xfffffffeU | psVar112->infinity & 1U;
    psStack_4c8 = (secp256k1_fe *)0x158dd9;
    secp256k1_gej_verify(&sStack_4c0);
    psStack_4c8 = (secp256k1_fe *)0x158de4;
    psVar107 = psVar112;
    iVar110 = gej_xyz_equals_gej(&sStack_4c0,psVar112);
    __src = psVar118;
    if (iVar110 != 0) {
      return;
    }
  }
  psStack_4c8 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_4c8 = psVar121;
  psStack_4d0 = psVar108;
  puStack_4d8 = (undefined1 *)&sStack_4c0;
  psStack_4e0 = psVar113;
  psStack_4e8 = b_00;
  psStack_4f0 = psVar112;
  if ((*(int *)((long)__src + 0x90) != psVar107->infinity) || (*(int *)((long)__src + 0x90) != 0)) {
    return;
  }
  psStack_630 = (secp256k1_fe *)0x158e51;
  memcpy(&sStack_588,__src,0x98);
  psVar108 = &sStack_620;
  psStack_630 = (secp256k1_fe *)0x158e66;
  memcpy(psVar108,psVar107,0x98);
  psStack_630 = (secp256k1_fe *)0x158e6e;
  secp256k1_fe_normalize(&sStack_588);
  psStack_630 = (secp256k1_fe *)0x158e7e;
  secp256k1_fe_normalize(&sStack_558);
  psStack_630 = (secp256k1_fe *)0x158e8e;
  secp256k1_fe_normalize(&sStack_528);
  psStack_630 = (secp256k1_fe *)0x158e96;
  secp256k1_fe_normalize(psVar108);
  psVar121 = &sStack_5f0;
  psStack_630 = (secp256k1_fe *)0x158ea3;
  secp256k1_fe_normalize(psVar121);
  psVar113 = &sStack_5c0;
  psStack_630 = (secp256k1_fe *)0x158eb0;
  secp256k1_fe_normalize(psVar113);
  psStack_630 = (secp256k1_fe *)0x158eb8;
  secp256k1_fe_verify(&sStack_588);
  psStack_630 = (secp256k1_fe *)0x158ec0;
  secp256k1_fe_verify(psVar108);
  if (sStack_588.normalized == 0) {
    psStack_630 = (secp256k1_fe *)0x158fc5;
    gej_xyz_equals_gej_cold_6();
LAB_00158fc5:
    psVar121 = psVar108;
    psStack_630 = (secp256k1_fe *)0x158fca;
    gej_xyz_equals_gej_cold_5();
LAB_00158fca:
    psStack_630 = (secp256k1_fe *)0x158fcf;
    gej_xyz_equals_gej_cold_4();
LAB_00158fcf:
    psVar113 = psVar121;
    psStack_630 = (secp256k1_fe *)0x158fd4;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (sStack_620.normalized == 0) goto LAB_00158fc5;
    uVar101 = 4;
    do {
      uVar106 = sStack_620.n[uVar101];
      uVar102 = sStack_588.n[uVar101];
      if ((uVar102 >= uVar106 && uVar102 != uVar106) || (uVar102 < uVar106)) break;
      bVar122 = uVar101 != 0;
      uVar101 = uVar101 - 1;
    } while (bVar122);
    psStack_630 = (secp256k1_fe *)0x158f0a;
    secp256k1_fe_verify(&sStack_558);
    psStack_630 = (secp256k1_fe *)0x158f12;
    secp256k1_fe_verify(psVar121);
    if (sStack_558.normalized == 0) goto LAB_00158fca;
    if (sStack_5f0.normalized == 0) goto LAB_00158fcf;
    uVar101 = 4;
    do {
      uVar106 = sStack_5f0.n[uVar101];
      uVar102 = sStack_558.n[uVar101];
      if ((uVar102 >= uVar106 && uVar102 != uVar106) || (uVar102 < uVar106)) break;
      bVar122 = uVar101 != 0;
      uVar101 = uVar101 - 1;
    } while (bVar122);
    psStack_630 = (secp256k1_fe *)0x158f63;
    secp256k1_fe_verify(&sStack_528);
    psStack_630 = (secp256k1_fe *)0x158f6b;
    secp256k1_fe_verify(psVar113);
    if (sStack_528.normalized != 0) {
      if (sStack_5c0.normalized != 0) {
        uVar101 = 4;
        do {
          if (sStack_528.n[uVar101] != sStack_5c0.n[uVar101]) {
            return;
          }
          bVar122 = uVar101 != 0;
          uVar101 = uVar101 - 1;
        } while (bVar122);
        return;
      }
      goto LAB_00158fd9;
    }
  }
  psStack_630 = (secp256k1_fe *)0x158fd9;
  gej_xyz_equals_gej_cold_2();
LAB_00158fd9:
  psStack_630 = (secp256k1_fe *)secp256k1_gej_has_quad_y_var;
  gej_xyz_equals_gej_cold_1();
  if ((int)psVar113[3].n[0] == 0) {
    psStack_630 = &sStack_528;
    secp256k1_fe_mul(&sStack_660,psVar113 + 1,psVar113 + 2);
    secp256k1_fe_is_square_var(&sStack_660);
    return;
  }
  return;
}

Assistant:

static void random_fe_non_zero(secp256k1_fe *nz) {
    int tries = 10;
    while (--tries >= 0) {
        random_fe(nz);
        secp256k1_fe_normalize(nz);
        if (!secp256k1_fe_is_zero(nz)) {
            break;
        }
    }
    /* Infinitesimal probability of spurious failure here */
    CHECK(tries >= 0);
}